

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell::
~TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell
          (TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell *this)

{
  TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell *mem;
  TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell *this_local;
  
  mem = this;
  ~TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(WiningStateTest, Not_OneShot_ReadyOnly)
{
	addNoWiningHand();

	SelfDrawnSituation situation;
	situation.is_one_shot = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::OneShot));
}